

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O2

Pattern * __thiscall
compile_template<AST::DirectionAlternation>::operator()
          (compile_template<AST::DirectionAlternation> *this,Pattern *p)

{
  P_DirectionAlternation *this_00;
  _Vector_base<Direction,_std::allocator<Direction>_> _Stack_28;
  
  this_00 = (P_DirectionAlternation *)operator_new(0x20);
  std::vector<Direction,_std::allocator<Direction>_>::vector
            ((vector<Direction,_std::allocator<Direction>_> *)&_Stack_28,
             (vector<Direction,_std::allocator<Direction>_> *)(p + 1));
  P_DirectionAlternation::P_DirectionAlternation
            (this_00,(vector<Direction,_std::allocator<Direction>_> *)&_Stack_28);
  std::_Vector_base<Direction,_std::allocator<Direction>_>::~_Vector_base(&_Stack_28);
  return (Pattern *)this_00;
}

Assistant:

Pattern* operator()(AST::Pattern* p) {
        return compile((PClass*)p);
    }